

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O0

avl_node * avl_insert(avl_tree *tree,avl_node *node,avl_cmp_func *func)

{
  avl_node *paVar1;
  int iVar2;
  int iVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  code *in_RDX;
  avl_node *in_RSI;
  ulong *in_RDI;
  int bf_old;
  int bf;
  int cmp;
  avl_node *cur;
  avl_node *p;
  int local_38;
  int in_stack_ffffffffffffffcc;
  avl_node *local_28;
  avl_node *local_18;
  
  local_28 = (avl_node *)0x0;
  paVar5 = (avl_node *)*in_RDI;
  while (paVar5 != (avl_node *)0x0) {
    in_stack_ffffffffffffffcc = (*in_RDX)(paVar5,in_RSI,in_RDI[1]);
    local_28 = paVar5;
    if (in_stack_ffffffffffffffcc < 1) {
      if (-1 < in_stack_ffffffffffffffcc) {
        return paVar5;
      }
      paVar5 = paVar5->right;
    }
    else {
      paVar5 = paVar5->left;
    }
  }
  avl_set_parent(in_RSI,local_28);
  avl_set_bf(in_RSI,0);
  in_RSI->right = (avl_node *)0x0;
  in_RSI->left = (avl_node *)0x0;
  if (local_28 == (avl_node *)0x0) {
    *in_RDI = (ulong)in_RSI;
  }
  else {
    iVar2 = (*in_RDX)(local_28,in_RSI,in_RDI[1]);
    if (iVar2 < 1) {
      local_28->right = in_RSI;
    }
    else {
      local_28->left = in_RSI;
    }
  }
  local_38 = 0;
  paVar4 = in_RSI;
  do {
    local_18 = paVar4;
    if (local_18 == (avl_node *)0x0) {
      return (avl_node *)0x0;
    }
    paVar4 = (avl_node *)((ulong)local_18->parent & 0xfffffffffffffffc);
    if (paVar4 == (avl_node *)0x0) {
      if (local_18 == (avl_node *)*in_RDI) {
        paVar5 = _balance_tree(paVar5,in_stack_ffffffffffffffcc);
        *in_RDI = (ulong)paVar5;
        return local_18;
      }
    }
    else {
      paVar1 = local_18->parent;
      if (paVar4->right == local_18) {
        local_18 = _balance_tree(paVar5,in_stack_ffffffffffffffcc);
        paVar4->right = local_18;
      }
      else {
        local_18 = _balance_tree(paVar5,in_stack_ffffffffffffffcc);
        paVar4->left = local_18;
      }
      if ((local_18->left == (avl_node *)0x0) && (local_18->right == (avl_node *)0x0)) {
        if (paVar4->left == local_18) {
          local_38 = -1;
        }
        else {
          local_38 = 1;
        }
      }
      else {
        local_38 = 0;
        iVar2 = _abs(((uint)paVar1 & 3) - 1);
        iVar3 = _abs(((uint)local_18->parent & 3) - 1);
        if (iVar2 < iVar3) {
          if (paVar4->left == local_18) {
            local_38 = -1;
          }
          else {
            local_38 = 1;
          }
        }
      }
    }
  } while (local_38 != 0);
  return local_18;
}

Assistant:

struct avl_node* avl_insert(struct avl_tree *tree,
                            struct avl_node *node,
                            avl_cmp_func *func)
{
    __AVL_DEBUG_INSERT(node);

    struct avl_node *p=NULL,*cur;
    int cmp, bf, bf_old;

    cur = tree->root;
    while(cur)
    {
        cmp = func(cur, node, tree->aux);
        p = cur;

        if(cmp > 0) {
            cur = cur->left;
        }else if (cmp < 0){
            cur = cur->right;
        }else {
            // duplicated key -> return
            return cur;
        }
    }

    avl_set_parent(node, p);
    avl_set_bf(node, 0);
    node->left = node->right = NULL;
#ifdef _AVL_NEXT_POINTER
    node->prev = node->next = NULL;
#endif

    // P is parent node of CUR
    if(p) {
        if(func(p, node, tree->aux) > 0) {
            p->left = node;
#ifdef _AVL_NEXT_POINTER
            node->next = p;
            node->prev = p->prev;
            if (p->prev) p->prev->next = node;
            p->prev = node;
#endif

        }else {
            p->right = node;
#ifdef _AVL_NEXT_POINTER
            node->prev = p;
            node->next = p->next;
            if (p->next) p->next->prev = node;
            p->next = node;
#endif
        }

    } else {
        // no parent .. make NODE as root
        tree->root = node;
    }

    // recursive balancing process .. scan from leaf to root
    bf = 0;
    while(node) {
        p = avl_parent(node);

        if (p) {
            // if parent exists
            bf_old = avl_bf(node);

            if (p->right == node) {
                node = _balance_tree(node, bf);
                p->right = node;
            }else {
                node = _balance_tree(node, bf);
                p->left = node;
            }

            // calculate balance facter BF for parent
            if (node->left == NULL && node->right == NULL) {
                // leaf node
                if (p->left == node) bf = -1;
                else bf = 1;
            } else {
                // index ndoe
                bf = 0;
                if (_abs(bf_old) < _abs(avl_bf(node))) {
                    // if ABS of balance factor increases
                    // cascade to parent
                    if (p->left == node) bf = -1;
                    else bf = 1;
                }
            }

        } else if(node == tree->root){
            tree->root = _balance_tree(tree->root, bf);
            break;
        }
        if (bf == 0) break;

        node = p;
    }

    __AVL_DEBUG_DISPLAY(tree);

    return node;
}